

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_backend.cpp
# Opt level: O2

void __thiscall basisu::basisu_backend::create_encoder_blocks(basisu_backend *this)

{
  basisu_backend_slice_desc_vec *this_00;
  vector<basisu::vector2D<basisu::encoder_block>_> *this_01;
  float fVar1;
  bool bVar2;
  basis_texture_type bVar3;
  uint new_width;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  basisu_frontend *this_02;
  double dVar8;
  uint32_t uVar9;
  int iVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  uint uVar13;
  uint32_t uVar14;
  basisu_backend_slice_desc *pbVar15;
  vector2D<basisu::encoder_block> *pvVar16;
  encoder_block *peVar17;
  encoder_block *peVar18;
  pixel_block *pBlock_pixels;
  anon_union_8_2_04352b30_for_etc_block_0 *paVar19;
  uint64_t uVar20;
  ulong uVar21;
  endpoint_cluster_etc_params *peVar22;
  uint uVar23;
  size_t siglen;
  ulong uVar24;
  ulong uVar25;
  uint32_t block_index;
  uint32_t y;
  uint32_t x;
  size_t in_R8;
  uint32_t endpoint_pred;
  long lVar26;
  ulong i;
  uint32_t uVar27;
  uint32_t endpoint_pred_1;
  size_t i_00;
  ulong uVar28;
  float fVar29;
  uint local_15c;
  uint local_158;
  uint local_154;
  uint local_150;
  uint local_124;
  ulong local_120;
  color_rgba pred_color;
  uint_vec all_endpoint_indices;
  etc_block etc_blk;
  etc_block trial_etc_block;
  interval_timer tm;
  color_rgba trial_colors [16];
  
  debug_printf("basisu_backend::create_encoder_blocks\n");
  interval_timer::interval_timer(&tm);
  interval_timer::start(&tm);
  this_02 = this->m_pFront_end;
  bVar3 = (this_02->m_params).m_tex_type;
  this_01 = &this->m_slice_encoder_blocks;
  vector<basisu::vector2D<basisu::encoder_block>_>::resize
            (this_01,(ulong)(this->m_slices).m_size,false);
  all_endpoint_indices.m_p = (uint *)0x0;
  all_endpoint_indices.m_size = 0;
  all_endpoint_indices.m_capacity = 0;
  uVar9 = get_total_blocks(this);
  vector<unsigned_int>::reserve(&all_endpoint_indices,(ulong)uVar9);
  this_00 = &this->m_slices;
  i = 0;
  local_15c = 0;
  local_150 = 0;
  local_158 = 0;
  do {
    if ((this->m_slices).m_size <= i) {
      uVar9 = get_total_blocks(this);
      uVar14 = get_total_blocks(this);
      uVar27 = get_total_blocks(this);
      debug_printf("total_endpoint_pred_missed: %u (%3.2f%%) total_endpoint_pred_hit: %u (%3.2f%%), total_block_endpoints_remapped: %u (%3.2f%%)\n"
                   ,SUB84((double)(((float)local_158 * 100.0) / (float)uVar9),0),
                   (double)(((float)local_150 * 100.0) / (float)uVar14),
                   (double)(((float)local_15c * 100.0) / (float)uVar27));
      reoptimize_and_sort_endpoints_codebook(this,local_15c,&all_endpoint_indices);
      sort_selector_codebook(this);
      check_for_valid_cr_blocks(this);
      dVar8 = interval_timer::get_elapsed_secs(&tm);
      debug_printf("Elapsed time: %3.3f secs\n",SUB84(dVar8,0));
      free(all_endpoint_indices.m_p);
      return;
    }
    iVar10 = -1;
    if (bVar3 == cBASISTexTypeVideoFrames) {
      iVar10 = find_video_frame(this,(int)i,-1);
    }
    pbVar15 = vector<basisu::basisu_backend_slice_desc>::operator[](this_00,i);
    bVar2 = pbVar15->m_iframe;
    pbVar15 = vector<basisu::basisu_backend_slice_desc>::operator[](this_00,i);
    uVar9 = pbVar15->m_first_block_index;
    pbVar15 = vector<basisu::basisu_backend_slice_desc>::operator[](this_00,i);
    new_width = pbVar15->m_num_blocks_x;
    pbVar15 = vector<basisu::basisu_backend_slice_desc>::operator[](this_00,i);
    uVar14 = pbVar15->m_num_blocks_y;
    pvVar16 = vector<basisu::vector2D<basisu::encoder_block>_>::operator[](this_01,i);
    vector2D<basisu::encoder_block>::resize(pvVar16,new_width,uVar14);
    i_00 = (size_t)iVar10;
    for (uVar27 = 0; uVar27 != uVar14; uVar27 = uVar27 + 1) {
      for (uVar25 = 0; uVar25 != new_width; uVar25 = uVar25 + 1) {
        pvVar16 = vector<basisu::vector2D<basisu::encoder_block>_>::operator[](this_01,i);
        x = (uint32_t)uVar25;
        peVar17 = vector2D<basisu::encoder_block>::operator()(pvVar16,x,uVar27);
        block_index = uVar27 * new_width + uVar9 + x;
        uVar11 = basisu_frontend::get_subblock_endpoint_cluster_index(this_02,block_index,0);
        peVar17->m_endpoint_index = uVar11;
        peVar18 = peVar17;
        uVar11 = basisu_frontend::get_subblock_endpoint_cluster_index(this_02,block_index,0);
        uVar12 = basisu_frontend::get_subblock_endpoint_cluster_index(this_02,block_index,1);
        verify((EVP_PKEY_CTX *)(ulong)(uVar11 == uVar12),(uchar *)0x1bd,siglen,(uchar *)peVar18,
               in_R8);
        uVar11 = basisu_frontend::get_block_selector_cluster_index(this_02,block_index);
        peVar17->m_selector_index = uVar11;
        peVar17->m_endpoint_predictor = 3;
        iVar4 = peVar17->m_endpoint_index;
        uVar11 = 0xffffffff;
        for (lVar26 = 0; lVar26 != 3; lVar26 = lVar26 + 1) {
          if (lVar26 == 2 && bVar3 == cBASISTexTypeVideoFrames) {
            if (iVar10 != -1 && (bVar2 & 1U) == 0) {
              pvVar16 = vector<basisu::vector2D<basisu::encoder_block>_>::operator[](this_01,i);
              peVar18 = vector2D<basisu::encoder_block>::operator()(pvVar16,x,uVar27);
              iVar5 = peVar18->m_endpoint_index;
              pvVar16 = vector<basisu::vector2D<basisu::encoder_block>_>::operator[](this_01,i);
              peVar18 = vector2D<basisu::encoder_block>::operator()(pvVar16,x,uVar27);
              iVar6 = peVar18->m_selector_index;
              pvVar16 = vector<basisu::vector2D<basisu::encoder_block>_>::operator[](this_01,i_00);
              peVar18 = vector2D<basisu::encoder_block>::operator()(pvVar16,x,uVar27);
              iVar7 = peVar18->m_endpoint_index;
              pvVar16 = vector<basisu::vector2D<basisu::encoder_block>_>::operator[](this_01,i_00);
              peVar18 = vector2D<basisu::encoder_block>::operator()(pvVar16,x,uVar27);
              if ((iVar5 == iVar7) && (iVar6 == peVar18->m_selector_index)) {
                pvVar16 = vector<basisu::vector2D<basisu::encoder_block>_>::operator[](this_01,i_00)
                ;
                peVar18 = vector2D<basisu::encoder_block>::operator()(pvVar16,x,uVar27);
                peVar18->m_is_cr_target = true;
                uVar11 = 2;
              }
            }
          }
          else {
            uVar12 = (int)*(char *)((long)&g_endpoint_preds + lVar26 * 2) + x;
            if ((((-1 < (int)uVar12) && ((int)uVar12 < (int)new_width)) &&
                (y = (int)*(char *)((long)&g_endpoint_preds + lVar26 * 2 + 1) + uVar27, -1 < (int)y)
                ) && ((int)y < (int)uVar14)) {
              pvVar16 = vector<basisu::vector2D<basisu::encoder_block>_>::operator[](this_01,i);
              peVar18 = vector2D<basisu::encoder_block>::operator()(pvVar16,uVar12,y);
              uVar23 = (uint)lVar26;
              if (uVar11 <= (uint)lVar26) {
                uVar23 = uVar11;
              }
              if (peVar18->m_endpoint_index == iVar4) {
                uVar11 = uVar23;
              }
            }
          }
        }
        if (uVar11 == 0xffffffff) {
          if ((this->m_params).m_endpoint_rdo_quality_thresh <= 0.0) {
LAB_00203557:
            local_158 = local_158 + 1;
          }
          else {
            pBlock_pixels =
                 vector<basisu::pixel_block>::operator[]
                           (&this_02->m_source_blocks,(ulong)block_index);
            paVar19 = &vector<basisu::etc_block>::operator[]
                                 (&this_02->m_encoded_blocks,(ulong)block_index)->field_0;
            etc_blk.field_0 = *paVar19;
            uVar20 = etc_block::evaluate_etc1_error
                               (&etc_blk,(color_rgba *)pBlock_pixels,
                                (this_02->m_params).m_perceptual,-1);
            if (uVar20 != 0) {
              fVar1 = (this->m_params).m_endpoint_rdo_quality_thresh;
              fVar29 = 1.0;
              if (1.0 <= fVar1) {
                fVar29 = fVar1;
              }
              uVar21 = (ulong)(fVar29 * (float)uVar20);
              uVar21 = (long)(fVar29 * (float)uVar20 - 9.223372e+18) & (long)uVar21 >> 0x3f | uVar21
              ;
              trial_etc_block = etc_blk;
              local_154 = 0xffffffff;
              local_120 = 0xffffffffffffffff;
              local_124 = 0;
              for (uVar28 = 0; uVar28 != 3; uVar28 = uVar28 + 1) {
                if (((bVar3 != cBASISTexTypeVideoFrames || uVar28 != 2) &&
                    (uVar11 = (int)*(char *)((long)&g_endpoint_preds + uVar28 * 2) + x,
                    -1 < (int)uVar11)) &&
                   (((int)uVar11 < (int)new_width &&
                    ((uVar12 = (int)*(char *)((long)&g_endpoint_preds + uVar28 * 2 + 1) + uVar27,
                     -1 < (int)uVar12 && ((int)uVar12 < (int)uVar14)))))) {
                  pvVar16 = vector<basisu::vector2D<basisu::encoder_block>_>::operator[](this_01,i);
                  peVar18 = vector2D<basisu::encoder_block>::operator()(pvVar16,uVar11,uVar12);
                  uVar23 = peVar18->m_endpoint_index;
                  peVar22 = vector<basisu::basisu_frontend::endpoint_cluster_etc_params>::operator[]
                                      (&this_02->m_endpoint_cluster_etc_params,(ulong)uVar23);
                  uVar11 = peVar22->m_inten_table[0];
                  peVar22 = vector<basisu::basisu_frontend::endpoint_cluster_etc_params>::operator[]
                                      (&this_02->m_endpoint_cluster_etc_params,(ulong)uVar23);
                  pred_color.field_0 =
                       (anon_union_4_2_6eba8969_for_color_rgba_0)
                       *(anon_union_4_2_6eba8969_for_color_rgba_0 *)
                        &peVar22->m_color_unscaled[0].field_0.field_1;
                  etc_block::set_block_color5(&trial_etc_block,&pred_color,&pred_color);
                  etc_block::set_inten_table(&trial_etc_block,0,uVar11);
                  etc_block::set_inten_table(&trial_etc_block,1,uVar11);
                  unpack_etc1(&trial_etc_block,trial_colors,false);
                  if ((this_02->m_params).m_perceptual == false) {
                    uVar24 = 0;
                    lVar26 = 0;
                    do {
                      if (lVar26 + 4 == 0x44) break;
                      uVar13 = color_distance((color_rgba *)
                                              ((long)&pBlock_pixels->m_pixels[0][0].field_0 + lVar26
                                              ),(color_rgba *)
                                                ((long)&trial_colors[0].field_0 + lVar26),false);
                      uVar24 = uVar24 + uVar13;
                      lVar26 = lVar26 + 4;
                    } while (uVar24 <= uVar21);
                  }
                  else {
                    uVar24 = 0;
                    lVar26 = 0;
                    do {
                      if (lVar26 + 4 == 0x44) break;
                      uVar11 = color_distance(true,(color_rgba *)
                                                   ((long)&pBlock_pixels->m_pixels[0][0].field_0 +
                                                   lVar26),
                                              (color_rgba *)
                                              ((long)&trial_colors[0].field_0 + lVar26),false);
                      uVar24 = uVar24 + uVar11;
                      lVar26 = lVar26 + 4;
                    } while (uVar24 <= uVar21);
                  }
                  if ((uVar24 <= uVar21) &&
                     ((uVar24 < local_120 || ((uVar24 == local_120 && (uVar28 < local_154)))))) {
                    local_154 = (uint)uVar28;
                    local_124 = uVar23;
                    local_120 = uVar24;
                  }
                }
              }
              if (local_154 == 0xffffffff) goto LAB_00203557;
              peVar17->m_endpoint_index = local_124;
              peVar17->m_endpoint_predictor = local_154;
              local_150 = local_150 + 1;
              local_15c = local_15c + 1;
            }
          }
          uVar11 = peVar17->m_endpoint_predictor;
        }
        else {
          peVar17->m_endpoint_predictor = uVar11;
          local_150 = local_150 + 1;
        }
        if (uVar11 == 3) {
          trial_colors[0].field_0 =
               (anon_union_4_2_6eba8969_for_color_rgba_0)peVar17->m_endpoint_index;
          vector<unsigned_int>::push_back(&all_endpoint_indices,(uint *)trial_colors);
        }
      }
    }
    i = i + 1;
  } while( true );
}

Assistant:

void basisu_backend::create_encoder_blocks()
	{
		debug_printf("basisu_backend::create_encoder_blocks\n");

		interval_timer tm;
		tm.start();

		basisu_frontend& r = *m_pFront_end;
		const bool is_video = r.get_params().m_tex_type == basist::cBASISTexTypeVideoFrames;

		m_slice_encoder_blocks.resize(m_slices.size());

		uint32_t total_endpoint_pred_missed = 0, total_endpoint_pred_hits = 0, total_block_endpoints_remapped = 0;

		uint_vec all_endpoint_indices;
		all_endpoint_indices.reserve(get_total_blocks());

		for (uint32_t slice_index = 0; slice_index < m_slices.size(); slice_index++)
		{
			const int prev_frame_slice_index = is_video ? find_video_frame(slice_index, -1) : -1;
			const bool is_iframe = m_slices[slice_index].m_iframe;
			const uint32_t first_block_index = m_slices[slice_index].m_first_block_index;

			//const uint32_t width = m_slices[slice_index].m_width;
			//const uint32_t height = m_slices[slice_index].m_height;
			const uint32_t num_blocks_x = m_slices[slice_index].m_num_blocks_x;
			const uint32_t num_blocks_y = m_slices[slice_index].m_num_blocks_y;

			m_slice_encoder_blocks[slice_index].resize(num_blocks_x, num_blocks_y);

			for (uint32_t block_y = 0; block_y < num_blocks_y; block_y++)
			{
				for (uint32_t block_x = 0; block_x < num_blocks_x; block_x++)
				{
					const uint32_t block_index = first_block_index + block_x + block_y * num_blocks_x;

					encoder_block& m = m_slice_encoder_blocks[slice_index](block_x, block_y);

					m.m_endpoint_index = r.get_subblock_endpoint_cluster_index(block_index, 0);
					BASISU_BACKEND_VERIFY(r.get_subblock_endpoint_cluster_index(block_index, 0) == r.get_subblock_endpoint_cluster_index(block_index, 1));

					m.m_selector_index = r.get_block_selector_cluster_index(block_index);

					m.m_endpoint_predictor = basist::NO_ENDPOINT_PRED_INDEX;

					const uint32_t block_endpoint = m.m_endpoint_index;

					uint32_t best_endpoint_pred = UINT32_MAX;

					for (uint32_t endpoint_pred = 0; endpoint_pred < basist::NUM_ENDPOINT_PREDS; endpoint_pred++)
					{
						if ((is_video) && (endpoint_pred == basist::CR_ENDPOINT_PRED_INDEX))
						{
							if ((prev_frame_slice_index != -1) && (!is_iframe))
							{
								const uint32_t cur_endpoint = m_slice_encoder_blocks[slice_index](block_x, block_y).m_endpoint_index;
								const uint32_t cur_selector = m_slice_encoder_blocks[slice_index](block_x, block_y).m_selector_index;
								const uint32_t prev_endpoint = m_slice_encoder_blocks[prev_frame_slice_index](block_x, block_y).m_endpoint_index;
								const uint32_t prev_selector = m_slice_encoder_blocks[prev_frame_slice_index](block_x, block_y).m_selector_index;
								if ((cur_endpoint == prev_endpoint) && (cur_selector == prev_selector))
								{
									best_endpoint_pred = basist::CR_ENDPOINT_PRED_INDEX;
									m_slice_encoder_blocks[prev_frame_slice_index](block_x, block_y).m_is_cr_target = true;
								}
							}
						}
						else
						{
							int pred_block_x = block_x + g_endpoint_preds[endpoint_pred].m_dx;
							if ((pred_block_x < 0) || (pred_block_x >= (int)num_blocks_x))
								continue;

							int pred_block_y = block_y + g_endpoint_preds[endpoint_pred].m_dy;
							if ((pred_block_y < 0) || (pred_block_y >= (int)num_blocks_y))
								continue;

							uint32_t pred_endpoint = m_slice_encoder_blocks[slice_index](pred_block_x, pred_block_y).m_endpoint_index;

							if (pred_endpoint == block_endpoint)
							{
								if (endpoint_pred < best_endpoint_pred)
								{
									best_endpoint_pred = endpoint_pred;
								}
							}
						}

					} // endpoint_pred

					if (best_endpoint_pred != UINT32_MAX)
					{
						m.m_endpoint_predictor = best_endpoint_pred;

						total_endpoint_pred_hits++;
					}
					else if (m_params.m_endpoint_rdo_quality_thresh > 0.0f)
					{
						const pixel_block& src_pixels = r.get_source_pixel_block(block_index);

						etc_block etc_blk(r.get_output_block(block_index));

						uint64_t cur_err = etc_blk.evaluate_etc1_error(src_pixels.get_ptr(), r.get_params().m_perceptual);

						if (cur_err)
						{
							const uint64_t thresh_err = (uint64_t)(cur_err * maximum(1.0f, m_params.m_endpoint_rdo_quality_thresh));

							etc_block trial_etc_block(etc_blk);

							uint64_t best_err = UINT64_MAX;
							uint32_t best_endpoint_index = 0;

							best_endpoint_pred = UINT32_MAX;

							for (uint32_t endpoint_pred = 0; endpoint_pred < basist::NUM_ENDPOINT_PREDS; endpoint_pred++)
							{
								if ((is_video) && (endpoint_pred == basist::CR_ENDPOINT_PRED_INDEX))
									continue;

								int pred_block_x = block_x + g_endpoint_preds[endpoint_pred].m_dx;
								if ((pred_block_x < 0) || (pred_block_x >= (int)num_blocks_x))
									continue;

								int pred_block_y = block_y + g_endpoint_preds[endpoint_pred].m_dy;
								if ((pred_block_y < 0) || (pred_block_y >= (int)num_blocks_y))
									continue;

								uint32_t pred_endpoint_index = m_slice_encoder_blocks[slice_index](pred_block_x, pred_block_y).m_endpoint_index;

								uint32_t pred_inten = r.get_endpoint_cluster_inten_table(pred_endpoint_index, false);
								color_rgba pred_color = r.get_endpoint_cluster_unscaled_color(pred_endpoint_index, false);

								trial_etc_block.set_block_color5(pred_color, pred_color);
								trial_etc_block.set_inten_table(0, pred_inten);
								trial_etc_block.set_inten_table(1, pred_inten);

								color_rgba trial_colors[16];
								unpack_etc1(trial_etc_block, trial_colors);

								uint64_t trial_err = 0;
								if (r.get_params().m_perceptual)
								{
									for (uint32_t p = 0; p < 16; p++)
									{
										trial_err += color_distance(true, src_pixels.get_ptr()[p], trial_colors[p], false);
										if (trial_err > thresh_err)
											break;
									}
								}
								else
								{
									for (uint32_t p = 0; p < 16; p++)
									{
										trial_err += color_distance(false, src_pixels.get_ptr()[p], trial_colors[p], false);
										if (trial_err > thresh_err)
											break;
									}
								}

								if (trial_err <= thresh_err)
								{
									if ((trial_err < best_err) || ((trial_err == best_err) && (endpoint_pred < best_endpoint_pred)))
									{
										best_endpoint_pred = endpoint_pred;
										best_err = trial_err;
										best_endpoint_index = pred_endpoint_index;
									}
								}
							} // endpoint_pred

							if (best_endpoint_pred != UINT32_MAX)
							{
								m.m_endpoint_index = best_endpoint_index;
								m.m_endpoint_predictor = best_endpoint_pred;

								total_endpoint_pred_hits++;
								total_block_endpoints_remapped++;
							}
							else
							{
								total_endpoint_pred_missed++;
							}
						}
					}
					else
					{
						total_endpoint_pred_missed++;
					}

					if (m.m_endpoint_predictor == basist::NO_ENDPOINT_PRED_INDEX)
					{
						all_endpoint_indices.push_back(m.m_endpoint_index);
					}

				} // block_x

			} // block_y

		} // slice

		debug_printf("total_endpoint_pred_missed: %u (%3.2f%%) total_endpoint_pred_hit: %u (%3.2f%%), total_block_endpoints_remapped: %u (%3.2f%%)\n",
			total_endpoint_pred_missed, total_endpoint_pred_missed * 100.0f / get_total_blocks(),
			total_endpoint_pred_hits, total_endpoint_pred_hits * 100.0f / get_total_blocks(),
			total_block_endpoints_remapped, total_block_endpoints_remapped * 100.0f / get_total_blocks());

		reoptimize_and_sort_endpoints_codebook(total_block_endpoints_remapped, all_endpoint_indices);

		sort_selector_codebook();
		check_for_valid_cr_blocks();
		
		debug_printf("Elapsed time: %3.3f secs\n", tm.get_elapsed_secs());
	}